

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O1

void __thiscall QSettings::beginWriteArray(QSettings *this,QAnyStringView prefix,int size)

{
  QSettingsPrivate *this_00;
  undefined4 in_register_0000000c;
  long in_FS_OFFSET;
  QAnyStringView key;
  QAnyStringView key_00;
  QString local_68;
  anon_union_24_3_e3d07ef4_for_data local_50;
  undefined8 local_38;
  long local_30;
  long local_28;
  
  key_00.m_size._4_4_ = in_register_0000000c;
  key_00.m_size._0_4_ = size;
  key_00.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)prefix.m_size;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QSettingsPrivate *)(this->super_QObject).d_ptr.d;
  QSettingsPrivate::normalizedKey(&local_68,(QSettingsPrivate *)prefix.field_0.m_data,key_00);
  local_50.shared = (PrivateShared *)local_68.d.d;
  local_50._8_8_ = local_68.d.ptr;
  local_50._16_8_ = local_68.d.size;
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_38 = 0;
  local_30 = -(ulong)(-1 < size);
  QSettingsPrivate::beginGroupOrArray(this_00,(QSettingsGroup *)&local_50);
  if ((QArrayData *)local_50.shared != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_50.shared)->ref)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&(local_50.shared)->ref)->_q_value).super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_50.shared)->ref)->_q_value).super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate((QArrayData *)local_50.shared,2,0x10);
    }
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (size < 0) {
    remove(this,"size");
  }
  else {
    ::QVariant::QVariant((QVariant *)&local_50,size);
    key.m_size = 0x4000000000000004;
    key.field_0.m_data_utf8 = "size";
    setValue(this,key,(QVariant *)&local_50);
    ::QVariant::~QVariant((QVariant *)&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSettings::beginWriteArray(QAnyStringView prefix, int size)
{
    Q_D(QSettings);
    d->beginGroupOrArray(QSettingsGroup(d->normalizedKey(prefix), size < 0));

    if (size < 0)
        remove("size"_L1);
    else
        setValue("size"_L1, size);
}